

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::ScaleLayerParams::ScaleLayerParams(ScaleLayerParams *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ScaleLayerParams_003d45c8;
  (this->shapebias_).current_size_ = 0;
  (this->shapebias_).total_size_ = 0;
  (this->shapebias_).rep_ = (Rep *)0x0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->shapescale_).current_size_ = 0;
  (this->shapescale_).total_size_ = 0;
  (this->shapescale_).rep_ = (Rep *)0x0;
  if (this != (ScaleLayerParams *)&_ScaleLayerParams_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  this->scale_ = (WeightParams *)0x0;
  this->bias_ = (WeightParams *)0x0;
  this->hasbias_ = false;
  this->_cached_size_ = 0;
  return;
}

Assistant:

ScaleLayerParams::ScaleLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.ScaleLayerParams)
}